

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg.c
# Opt level: O0

boolean mj_jpeg_empty_output_buffer(j_compress_ptr cinfo)

{
  long *plVar1;
  void *pvVar2;
  long *in_RDI;
  mj_jpeg_dest_ptr dest;
  JOCTET *ret;
  
  plVar1 = (long *)in_RDI[5];
  pvVar2 = realloc((void *)plVar1[5],plVar1[6] + 0x800);
  if (pvVar2 == (void *)0x0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x38;
    *(undefined4 *)(*in_RDI + 0x2c) = 0;
    (**(code **)*in_RDI)(in_RDI);
  }
  plVar1[5] = (long)pvVar2;
  plVar1[6] = plVar1[6] + 0x800;
  *plVar1 = plVar1[5] + plVar1[6] + -0x800;
  plVar1[1] = 0x800;
  return 1;
}

Assistant:

boolean mj_jpeg_empty_output_buffer(j_compress_ptr cinfo) {
    JOCTET *         ret;
    mj_jpeg_dest_ptr dest = (mj_jpeg_dest_ptr)cinfo->dest;

    ret = (JOCTET *)realloc(dest->buf, (dest->size + MJ_DESTBUFFER_CHUNKSIZE) * sizeof(JOCTET));
    if(ret == NULL) {
        ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 0);
    }
    dest->buf = ret;
    dest->size += MJ_DESTBUFFER_CHUNKSIZE;

    dest->pub.next_output_byte = dest->buf + (dest->size - MJ_DESTBUFFER_CHUNKSIZE);
    dest->pub.free_in_buffer = MJ_DESTBUFFER_CHUNKSIZE;

    return TRUE;
}